

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

KeyID __thiscall
anon_unknown.dwarf_1fd0be::BuildEngineImpl::getKeyID(BuildEngineImpl *this,KeyType *key)

{
  pair<llvm::StringRef,_llbuild::core::KeyID> KV;
  string *__x;
  StringMapEntry<llbuild::core::KeyID> *this_00;
  pair<llvm::StringMapIterator<llbuild::core::KeyID>,_bool> pVar1;
  StringRef local_b0;
  StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
  local_a0;
  undefined1 local_98;
  KeyID local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llbuild::core::KeyID>
  local_88;
  pair<llvm::StringRef,_llbuild::core::KeyID> local_60;
  StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
  local_48;
  undefined1 local_40;
  StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
  local_38;
  StringMapIterator<llbuild::core::KeyID> it;
  lock_guard<std::mutex> guard;
  KeyType *key_local;
  BuildEngineImpl *this_local;
  StringRef *local_10;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&this->keyTableMutex);
  __x = llbuild::core::KeyType::str_abi_cxx11_(key);
  local_90 = llbuild::core::KeyID::novalue();
  std::make_pair<std::__cxx11::string_const&,llbuild::core::KeyID>(&local_88,__x,&local_90);
  std::pair<llvm::StringRef,_llbuild::core::KeyID>::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llbuild::core::KeyID,_true>
            (&local_60,&local_88);
  KV.first.Length = local_60.first.Length;
  KV.first.Data = local_60.first.Data;
  KV.second._value = local_60.second._value;
  pVar1 = llvm::StringMap<llbuild::core::KeyID,_llvm::MallocAllocator>::insert(&this->keyTable,KV);
  local_a0.Ptr = (StringMapEntryBase **)
                 pVar1.first.
                 super_StringMapIterBase<llvm::StringMapIterator<llbuild::core::KeyID>,_llvm::StringMapEntry<llbuild::core::KeyID>_>
                 .Ptr;
  local_98 = pVar1.second;
  local_48.Ptr = local_a0.Ptr;
  local_40 = local_98;
  local_38.Ptr = local_a0.Ptr;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llbuild::core::KeyID>
  ::~pair(&local_88);
  this_00 = llvm::
            iterator_facade_base<llvm::StringMapIterator<llbuild::core::KeyID>,_std::forward_iterator_tag,_llvm::StringMapEntry<llbuild::core::KeyID>,_long,_llvm::StringMapEntry<llbuild::core::KeyID>_*,_llvm::StringMapEntry<llbuild::core::KeyID>_&>
            ::operator->((iterator_facade_base<llvm::StringMapIterator<llbuild::core::KeyID>,_std::forward_iterator_tag,_llvm::StringMapEntry<llbuild::core::KeyID>,_long,_llvm::StringMapEntry<llbuild::core::KeyID>_*,_llvm::StringMapEntry<llbuild::core::KeyID>_&>
                          *)&local_38);
  local_b0 = llvm::StringMapEntry<llbuild::core::KeyID>::getKey(this_00);
  local_10 = &local_b0;
  llbuild::core::KeyID::KeyID((KeyID *)&this_local,local_b0.Data);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return (KeyID)(ValueTy)this_local;
}

Assistant:

virtual const KeyID getKeyID(const KeyType& key) override {
    std::lock_guard<std::mutex> guard(keyTableMutex);

    // The RHS of the mapping is actually ignored, we use the StringMap's ptr
    // identity because it allows us to efficiently map back to the key string
    // in `getRuleInfoForKey`.
    auto it = keyTable.insert(std::make_pair(key.str(), KeyID::novalue())).first;
    return KeyID(it->getKey().data());
  }